

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

int av1_find_best_sub_pixel_tree_pruned
              (MACROBLOCKD *xd,AV1_COMMON *cm,SUBPEL_MOTION_SEARCH_PARAMS *ms_params,MV start_mv,
              FULLPEL_MV_STATS *start_mv_stats,MV *bestmv,int *distortion,uint *sse1,
              int_mv *last_mv_search_list)

{
  short sVar1;
  short sVar2;
  short sVar3;
  MV MVar4;
  MV MVar5;
  int iVar6;
  int iVar7;
  MV in_ECX;
  int *in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R8;
  MV *in_R9;
  SubpelMvLimits *in_stack_00000008;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_00000010;
  int_mv *in_stack_00000018;
  int dummy;
  MV top_right_mv;
  MV top_left_mv;
  MV bottom_right_mv;
  MV bottom_left_mv;
  MV top_mv;
  MV bottom_mv;
  MV right_mv;
  MV left_mv;
  uint whichdir;
  int is_scaled;
  scale_factors *sf;
  uint besterr;
  int hstep;
  int iter;
  SUBPEL_SEARCH_VAR_PARAMS *var_params;
  MV_COST_PARAMS *mv_cost_params;
  SubpelMvLimits *mv_limits;
  int *cost_list;
  int iters_per_step;
  int forced_stop;
  int allow_hp;
  MV diag_step_4;
  MV diag_step_2;
  MV diag_step;
  MV diag_mv;
  uint down;
  MV bottom_mv_1;
  uint up;
  MV top_mv_1;
  uint right;
  MV right_mv_1;
  uint left;
  int dummy_1;
  MV left_mv_1;
  MV diag_step_1;
  MV diag_mv_1;
  uint down_1;
  MV bottom_mv_2;
  uint up_1;
  MV top_mv_2;
  uint right_1;
  MV right_mv_2;
  uint left_1;
  int dummy_3;
  MV left_mv_2;
  MV diag_step_3;
  MV diag_mv_2;
  uint down_2;
  MV bottom_mv_3;
  uint up_2;
  MV top_mv_3;
  uint right_2;
  MV right_mv_3;
  uint left_2;
  int dummy_5;
  MV left_mv_3;
  MV diag_step_5;
  MV rev_mv_1;
  MV left_long_mv;
  MV right_long_mv;
  MV rev_mv;
  MV top_long_mv;
  MV bottom_long_mv;
  MV chess_mv_2;
  MV chess_mv_1;
  int dummy_2;
  int bc;
  int br;
  int tc;
  int tr;
  MV rev_mv_3;
  MV left_long_mv_1;
  MV right_long_mv_1;
  MV rev_mv_2;
  MV top_long_mv_1;
  MV bottom_long_mv_1;
  MV chess_mv_2_1;
  MV chess_mv_1_1;
  int dummy_4;
  int bc_1;
  int br_1;
  int tc_1;
  int tr_1;
  MV rev_mv_5;
  MV left_long_mv_2;
  MV right_long_mv_2;
  MV rev_mv_4;
  MV top_long_mv_2;
  MV bottom_long_mv_2;
  MV chess_mv_2_2;
  MV chess_mv_1_2;
  int dummy_6;
  int bc_2;
  int br_2;
  int tc_2;
  int tr_2;
  scale_factors *in_stack_fffffffffffffa90;
  MV_COST_PARAMS *in_stack_fffffffffffffa98;
  SUBPEL_SEARCH_VAR_PARAMS *in_stack_fffffffffffffaa0;
  MV *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  AV1_COMMON *in_stack_fffffffffffffab8;
  MACROBLOCKD *in_stack_fffffffffffffac0;
  uint in_stack_fffffffffffffad0;
  MV in_stack_fffffffffffffad4;
  short in_stack_fffffffffffffad8;
  short in_stack_fffffffffffffada;
  short in_stack_fffffffffffffadc;
  short in_stack_fffffffffffffade;
  short in_stack_fffffffffffffae0;
  short in_stack_fffffffffffffae2;
  short in_stack_fffffffffffffae4;
  short in_stack_fffffffffffffae6;
  short in_stack_fffffffffffffae8;
  short in_stack_fffffffffffffaea;
  short in_stack_fffffffffffffaec;
  short in_stack_fffffffffffffaee;
  short in_stack_fffffffffffffaf0;
  short in_stack_fffffffffffffaf2;
  short in_stack_fffffffffffffaf4;
  short in_stack_fffffffffffffaf6;
  uint in_stack_fffffffffffffaf8;
  int local_4f4;
  int local_4f0;
  int local_4ec;
  int *local_4e8;
  int *local_4e0;
  int *local_4d8;
  int *local_4d0;
  int local_4c4;
  uint local_4c0;
  int local_4bc;
  MV *local_4b8;
  int *local_4b0;
  undefined8 local_4a0;
  long local_498;
  MV local_48c;
  int local_488;
  MV local_484;
  int local_480;
  int local_47c;
  SubpelMvLimits *local_478;
  SUBPEL_SEARCH_VAR_PARAMS *local_470;
  int *local_468;
  int *local_460;
  int *local_458;
  int *local_450;
  int local_444;
  MV *local_440;
  undefined8 local_438;
  long local_430;
  MV local_428;
  MV local_424;
  int local_420;
  int local_41c;
  SubpelMvLimits *local_418;
  SUBPEL_SEARCH_VAR_PARAMS *local_410;
  int *local_408;
  int *local_400;
  int *local_3f8;
  int *local_3f0;
  int local_3e4;
  MV *local_3e0;
  undefined8 local_3d8;
  long local_3d0;
  MV local_3c8;
  MV local_3c4;
  int local_3c0;
  int local_3bc;
  SubpelMvLimits *local_3b8;
  SUBPEL_SEARCH_VAR_PARAMS *local_3b0;
  int *local_3a8;
  int *local_3a0;
  int *local_398;
  int *local_390;
  int local_384;
  MV *local_380;
  undefined8 local_378;
  long local_370;
  MV local_368;
  short local_364;
  short local_362;
  uint local_360;
  short local_35c;
  int16_t local_35a;
  uint local_358;
  short local_354;
  int16_t local_352;
  uint local_350;
  int16_t local_34c;
  short local_34a;
  uint local_348;
  MV local_344;
  short local_340;
  short local_33e;
  int local_33c;
  SubpelMvLimits *local_338;
  SUBPEL_SEARCH_VAR_PARAMS *local_330;
  int *local_328;
  int *local_320;
  int *local_318;
  int *local_310;
  int local_304;
  MV *local_300;
  undefined8 local_2f8;
  long local_2f0;
  MV local_2e4;
  MV local_2e0;
  short local_2dc;
  short local_2da;
  uint local_2d8;
  short local_2d4;
  int16_t local_2d2;
  uint local_2d0;
  short local_2cc;
  int16_t local_2ca;
  uint local_2c8;
  int16_t local_2c4;
  short local_2c2;
  uint local_2c0;
  MV local_2bc;
  int16_t local_2b8;
  short local_2b6;
  int local_2b4;
  SubpelMvLimits *local_2b0;
  SUBPEL_SEARCH_VAR_PARAMS *local_2a8;
  int *local_2a0;
  int *local_298;
  int *local_290;
  int *local_288;
  int local_27c;
  MV *local_278;
  undefined8 local_270;
  long local_268;
  MV local_25c;
  MV local_258;
  short local_254;
  short local_252;
  uint local_250;
  short local_24c;
  int16_t local_24a;
  uint local_248;
  short local_244;
  int16_t local_242;
  uint local_240;
  int16_t local_23c;
  short local_23a;
  uint local_238;
  MV local_234;
  int16_t local_230;
  short local_22e;
  int local_22c;
  SubpelMvLimits *local_228;
  SUBPEL_SEARCH_VAR_PARAMS *local_220;
  int *local_218;
  int *local_210;
  int *local_208;
  int *local_200;
  int local_1f4;
  MV *local_1f0;
  undefined8 local_1e8;
  long local_1e0;
  MV local_1d8;
  MV local_1d4;
  undefined2 local_1d0;
  short local_1ce;
  short local_1cc;
  short local_1ca;
  short local_1c8;
  short local_1c6;
  short local_1c4;
  undefined2 local_1c2;
  short local_1c0;
  short local_1be;
  short local_1bc;
  short local_1ba;
  short local_1b8;
  short local_1b6;
  short local_1b4;
  short local_1b2;
  MV local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  int local_1a0;
  int local_19c;
  SubpelMvLimits *local_198;
  SUBPEL_SEARCH_VAR_PARAMS *local_190;
  int *local_188;
  int *local_180;
  int *local_178;
  int *local_170;
  int local_164;
  MV *local_160;
  undefined8 local_158;
  long local_150;
  MV local_148;
  MV local_144;
  undefined2 local_140;
  short local_13e;
  short local_13c;
  short local_13a;
  short local_138;
  short local_136;
  short local_134;
  undefined2 local_132;
  short local_130;
  short local_12e;
  short local_12c;
  short local_12a;
  short local_128;
  short local_126;
  short local_124;
  short local_122;
  MV local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  SubpelMvLimits *local_108;
  SUBPEL_SEARCH_VAR_PARAMS *local_100;
  int *local_f8;
  int *local_f0;
  int *local_e8;
  int *local_e0;
  int local_d4;
  MV *local_d0;
  undefined8 local_c8;
  long local_c0;
  MV local_b8;
  MV local_b4;
  undefined2 local_b0;
  short local_ae;
  short local_ac;
  short local_aa;
  short local_a8;
  short local_a6;
  short local_a4;
  undefined2 local_a2;
  short local_a0;
  short local_9e;
  short local_9c;
  short local_9a;
  short local_98;
  short local_96;
  short local_94;
  short local_92;
  MV local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  SubpelMvLimits *local_78;
  SUBPEL_SEARCH_VAR_PARAMS *local_70;
  int *local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  int local_44;
  MV *local_40;
  undefined8 local_38;
  long local_30;
  MV local_28;
  MV local_24;
  
  local_4bc = *in_RDX;
  local_4c0 = (uint)*(byte *)(in_RDX + 4);
  local_4c4 = in_RDX[5];
  local_4d0 = *(int **)(in_RDX + 2);
  local_4d8 = in_RDX + 6;
  local_4e0 = in_RDX + 10;
  local_4e8 = in_RDX + 0x16;
  local_4ec = 0;
  local_4f0 = 4;
  local_4f4 = 0x7fffffff;
  *in_R9 = in_ECX;
  local_4b8 = in_R9;
  local_4b0 = in_R8;
  local_4a0 = in_RSI;
  local_498 = in_RDI;
  local_48c = in_ECX;
  is_intrabc_block((MB_MODE_INFO *)**(undefined8 **)(in_RDI + 0x1eb8));
  iVar6 = av1_is_scaled(in_stack_fffffffffffffa90);
  if ((local_4b0 == (int *)0x0) || (iVar6 != 0)) {
    local_4f4 = setup_center_error_facade
                          ((MACROBLOCKD *)in_stack_fffffffffffffab8,
                           (AV1_COMMON *)
                           CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
                           in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0,
                           in_stack_fffffffffffffa98,
                           (uint *)CONCAT44((int)((ulong)in_stack_fffffffffffffa90 >> 0x20),iVar6),
                           (int *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                           CONCAT22(in_stack_fffffffffffffada,in_stack_fffffffffffffad8));
  }
  else {
    local_4f4 = local_4b0[1] + *local_4b0;
    in_stack_00000008->col_min = local_4b0[1];
    *(int *)&in_stack_00000010->vfp = local_4b0[2];
  }
  if (local_4c0 == 3) {
    local_488 = local_4f4;
  }
  else {
    iVar7 = check_repeated_mv_and_update(in_stack_00000018,*local_4b8,local_4ec);
    if (iVar7 == 0) {
      local_4ec = local_4ec + 1;
      sVar1 = (short)local_4f0;
      if (((((local_4d0 == (int *)0x0) || (*local_4d0 == 0x7fffffff)) ||
           (local_4d0[1] == 0x7fffffff)) ||
          ((local_4d0[2] == 0x7fffffff || (local_4d0[3] == 0x7fffffff)))) ||
         (local_4d0[4] == 0x7fffffff)) {
        local_368 = local_48c;
        local_370 = local_498;
        local_378 = local_4a0;
        local_380 = local_4b8;
        local_384 = local_4f0;
        local_390 = local_4d8;
        local_398 = local_4e8;
        local_3a0 = local_4e0;
        local_3a8 = &local_4f4;
        local_3b0 = in_stack_00000010;
        local_3b8 = in_stack_00000008;
        local_3bc = local_4c4;
        local_2e4 = local_48c;
        local_2f0 = local_498;
        local_2f8 = local_4a0;
        local_300 = local_4b8;
        local_304 = local_4f0;
        local_310 = local_4d8;
        local_318 = local_4e8;
        local_320 = local_4e0;
        local_330 = in_stack_00000010;
        local_338 = in_stack_00000008;
        local_340 = local_48c.row;
        local_33e = local_48c.col - sVar1;
        local_344.row = 0;
        local_344.col = 0;
        local_3c0 = iVar6;
        local_33c = iVar6;
        local_328 = local_3a8;
        local_348 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),&local_344,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_34c = local_2e4.row;
        local_34a = local_2e4.col + (short)local_304;
        local_350 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_33c),&local_344
                                      ,local_338,local_330,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_354 = local_2e4.row - (short)local_304;
        local_352 = local_2e4.col;
        local_358 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_33c),&local_344
                                      ,local_338,local_330,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_35c = local_2e4.row + (short)local_304;
        local_35a = local_2e4.col;
        local_360 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_33c),&local_344
                                      ,local_338,local_330,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_2e0 = get_best_diag_step(local_304,local_348,local_350,local_358,local_360);
        local_364 = local_2e4.row + local_2e0.row;
        local_362 = local_2e4.col + local_2e0.col;
        check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                          (MV *)CONCAT44(in_stack_fffffffffffffab4,local_33c),&local_344,local_338,
                          local_330,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                          (uint *)CONCAT26(in_stack_fffffffffffffade,
                                           CONCAT24(in_stack_fffffffffffffadc,
                                                    CONCAT22(in_stack_fffffffffffffada,
                                                             in_stack_fffffffffffffad8))),
                          (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                           CONCAT24(in_stack_fffffffffffffae4,
                                                    CONCAT22(in_stack_fffffffffffffae2,
                                                             in_stack_fffffffffffffae0))),
                          (int *)CONCAT26(in_stack_fffffffffffffaee,
                                          CONCAT24(in_stack_fffffffffffffaec,
                                                   CONCAT22(in_stack_fffffffffffffaea,
                                                            in_stack_fffffffffffffae8))),
                          (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                          CONCAT24(in_stack_fffffffffffffaf4,
                                                   CONCAT22(in_stack_fffffffffffffaf2,
                                                            in_stack_fffffffffffffaf0))),
                          in_stack_fffffffffffffaf8);
        local_3c4 = local_2e0;
        MVar5 = local_148;
        if (1 < local_3bc) {
          local_144 = local_368;
          MVar4 = local_144;
          local_148 = local_2e0;
          MVar5 = local_148;
          local_150 = local_370;
          local_158 = local_378;
          local_160 = local_380;
          local_164 = local_384;
          local_170 = local_390;
          local_178 = local_398;
          local_180 = local_3a0;
          local_188 = local_3a8;
          local_190 = local_3b0;
          local_198 = local_3b8;
          local_19c = local_3c0;
          local_144.row = local_368.row;
          local_1a0 = (int)local_144.row;
          local_144.col = local_368.col;
          local_1a4 = (int)local_144.col;
          sVar1 = local_380->row;
          local_1a8 = (int)sVar1;
          sVar2 = local_380->col;
          local_1ac = (int)sVar2;
          local_1b0.row = 0;
          local_1b0.col = 0;
          local_148.row = local_2e0.row;
          local_148.col = local_2e0.col;
          local_148 = MVar5;
          local_144 = MVar4;
          if ((local_1a0 == local_1a8) || (local_1a4 == local_1ac)) {
            sVar3 = (short)local_384;
            if ((local_1a0 == local_1a8) && (local_1a4 != local_1ac)) {
              local_1bc = sVar1 + sVar3;
              local_1ba = sVar2 + local_148.col;
              local_1c0 = sVar1 - sVar3;
              local_1be = sVar2 + local_148.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_3c0),&local_1b0,
                                local_3b8,local_3b0,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_1c4 = (short)local_1a8 - local_148.row;
              local_1c2 = (undefined2)local_1ac;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              MVar5 = local_148;
            }
            else if ((local_1a0 != local_1a8) && (local_1a4 == local_1ac)) {
              local_1c8 = sVar1 + local_148.row;
              local_1c6 = sVar2 + sVar3;
              local_1cc = sVar1 + local_148.row;
              local_1ca = sVar2 - sVar3;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_3c0),&local_1b0,
                                local_3b8,local_3b0,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_1d0 = (undefined2)local_1a8;
              local_1ce = (short)local_1ac - local_148.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_19c),&local_1b0,
                                local_198,local_190,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              MVar5 = local_148;
            }
          }
          else {
            local_1b2 = sVar2 + local_148.col;
            local_1b8 = sVar1 + local_148.row;
            local_1b6 = sVar2;
            local_1b4 = sVar1;
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_3c0),&local_1b0,
                              local_3b8,local_3b0,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (uint *)CONCAT26(in_stack_fffffffffffffade,
                                               CONCAT24(in_stack_fffffffffffffadc,
                                                        CONCAT22(in_stack_fffffffffffffada,
                                                                 in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_19c),&local_1b0,
                              local_198,local_190,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (uint *)CONCAT26(in_stack_fffffffffffffade,
                                               CONCAT24(in_stack_fffffffffffffadc,
                                                        CONCAT22(in_stack_fffffffffffffada,
                                                                 in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
            MVar5 = local_148;
          }
        }
      }
      else {
        in_stack_fffffffffffffaf8 =
             (uint)(local_4d0[3] <= local_4d0[1]) + (uint)(local_4d0[4] <= local_4d0[2]) * 2;
        in_stack_fffffffffffffaf6 = local_48c.col - sVar1;
        in_stack_fffffffffffffaf2 = local_48c.col + sVar1;
        in_stack_fffffffffffffaec = local_48c.row + sVar1;
        in_stack_fffffffffffffae8 = local_48c.row - sVar1;
        in_stack_fffffffffffffae4 = local_48c.row + sVar1;
        in_stack_fffffffffffffae6 = local_48c.col - sVar1;
        in_stack_fffffffffffffae0 = local_48c.row + sVar1;
        in_stack_fffffffffffffae2 = local_48c.col + sVar1;
        in_stack_fffffffffffffadc = local_48c.row - sVar1;
        in_stack_fffffffffffffade = local_48c.col - sVar1;
        in_stack_fffffffffffffad8 = local_48c.row - sVar1;
        in_stack_fffffffffffffada = local_48c.col + sVar1;
        in_stack_fffffffffffffad4.row = 0;
        in_stack_fffffffffffffad4.col = 0;
        in_stack_fffffffffffffac0 = (MACROBLOCKD *)(ulong)in_stack_fffffffffffffaf8;
        in_stack_fffffffffffffaea = local_48c.col;
        in_stack_fffffffffffffaee = local_48c.col;
        in_stack_fffffffffffffaf0 = local_48c.row;
        in_stack_fffffffffffffaf4 = local_48c.row;
        MVar5 = local_148;
        switch(in_stack_fffffffffffffac0) {
        case (MACROBLOCKD *)0x0:
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)(ulong)in_stack_fffffffffffffad0,
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(local_48c.col,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(local_48c.col,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(local_48c.row,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              local_48c.row))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          MVar5 = local_148;
          break;
        case (MACROBLOCKD *)0x1:
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)(ulong)in_stack_fffffffffffffad0,
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(local_48c.col,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(local_48c.col,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(local_48c.row,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              local_48c.row))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          MVar5 = local_148;
          break;
        case (MACROBLOCKD *)0x2:
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)(ulong)in_stack_fffffffffffffad0,
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(local_48c.col,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(local_48c.col,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(local_48c.row,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              local_48c.row))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          MVar5 = local_148;
          break;
        case (MACROBLOCKD *)0x3:
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)(ulong)in_stack_fffffffffffffad0,
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(local_48c.col,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(local_48c.col,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(local_48c.row,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              local_48c.row))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                            (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),
                            (MV *)&stack0xfffffffffffffad4,in_stack_00000008,in_stack_00000010,
                            (MV_COST_PARAMS *)
                            CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                            (uint *)CONCAT26(in_stack_fffffffffffffade,
                                             CONCAT24(in_stack_fffffffffffffadc,
                                                      CONCAT22(in_stack_fffffffffffffada,
                                                               in_stack_fffffffffffffad8))),
                            (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                             CONCAT24(in_stack_fffffffffffffae4,
                                                      CONCAT22(in_stack_fffffffffffffae2,
                                                               in_stack_fffffffffffffae0))),
                            (int *)CONCAT26(in_stack_fffffffffffffaee,
                                            CONCAT24(in_stack_fffffffffffffaec,
                                                     CONCAT22(in_stack_fffffffffffffaea,
                                                              in_stack_fffffffffffffae8))),
                            (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                            CONCAT24(in_stack_fffffffffffffaf4,
                                                     CONCAT22(in_stack_fffffffffffffaf2,
                                                              in_stack_fffffffffffffaf0))),
                            in_stack_fffffffffffffaf8);
          MVar5 = local_148;
        }
      }
      local_148 = MVar5;
      MVar5 = local_b8;
      if ((int)local_4c0 < 2) {
        iVar7 = check_repeated_mv_and_update(in_stack_00000018,*local_4b8,local_4ec);
        if (iVar7 != 0) {
          return 0x7fffffff;
        }
        local_4ec = local_4ec + 1;
        local_4f0 = local_4f0 >> 1;
        local_48c = *local_4b8;
        local_3d0 = local_498;
        local_3d8 = local_4a0;
        local_3e0 = local_4b8;
        local_3f0 = local_4d8;
        local_3f8 = local_4e8;
        local_400 = local_4e0;
        local_408 = &local_4f4;
        local_410 = in_stack_00000010;
        local_418 = in_stack_00000008;
        local_41c = local_4c4;
        local_268 = local_498;
        local_270 = local_4a0;
        local_278 = local_4b8;
        local_288 = local_4d8;
        local_290 = local_4e8;
        local_298 = local_4e0;
        local_2a8 = in_stack_00000010;
        local_2b0 = in_stack_00000008;
        local_25c.row = local_48c.row;
        local_2b8 = local_25c.row;
        local_25c.col = local_48c.col;
        local_2b6 = local_25c.col - (short)local_4f0;
        local_2bc.row = 0;
        local_2bc.col = 0;
        local_420 = iVar6;
        local_3e4 = local_4f0;
        local_3c8 = local_48c;
        local_2b4 = iVar6;
        local_2a0 = local_408;
        local_27c = local_4f0;
        local_25c = local_48c;
        local_2c0 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),&local_2bc,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_2c4 = local_25c.row;
        local_2c2 = local_25c.col + (short)local_27c;
        local_2c8 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_2cc = local_25c.row - (short)local_27c;
        local_2ca = local_25c.col;
        local_2d0 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_2d4 = local_25c.row + (short)local_27c;
        local_2d2 = local_25c.col;
        local_2d8 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_2b4),&local_2bc
                                      ,local_2b0,local_2a8,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_258 = get_best_diag_step(local_27c,local_2c0,local_2c8,local_2d0,local_2d8);
        local_2dc = local_25c.row + local_258.row;
        local_2da = local_25c.col + local_258.col;
        check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                          (MV *)CONCAT44(in_stack_fffffffffffffab4,local_2b4),&local_2bc,local_2b0,
                          local_2a8,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                          (uint *)CONCAT26(in_stack_fffffffffffffade,
                                           CONCAT24(in_stack_fffffffffffffadc,
                                                    CONCAT22(in_stack_fffffffffffffada,
                                                             in_stack_fffffffffffffad8))),
                          (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                           CONCAT24(in_stack_fffffffffffffae4,
                                                    CONCAT22(in_stack_fffffffffffffae2,
                                                             in_stack_fffffffffffffae0))),
                          (int *)CONCAT26(in_stack_fffffffffffffaee,
                                          CONCAT24(in_stack_fffffffffffffaec,
                                                   CONCAT22(in_stack_fffffffffffffaea,
                                                            in_stack_fffffffffffffae8))),
                          (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                          CONCAT24(in_stack_fffffffffffffaf4,
                                                   CONCAT22(in_stack_fffffffffffffaf2,
                                                            in_stack_fffffffffffffaf0))),
                          in_stack_fffffffffffffaf8);
        local_424 = local_258;
        MVar5 = local_b8;
        if (1 < local_41c) {
          local_b4 = local_3c8;
          MVar4 = local_b4;
          local_b8 = local_258;
          MVar5 = local_b8;
          local_c0 = local_3d0;
          local_c8 = local_3d8;
          local_d0 = local_3e0;
          local_d4 = local_3e4;
          local_e0 = local_3f0;
          local_e8 = local_3f8;
          local_f0 = local_400;
          local_f8 = local_408;
          local_100 = local_410;
          local_108 = local_418;
          local_10c = local_420;
          local_b4.row = local_3c8.row;
          local_110 = (int)local_b4.row;
          local_b4.col = local_3c8.col;
          local_114 = (int)local_b4.col;
          sVar1 = local_3e0->row;
          local_118 = (int)sVar1;
          sVar2 = local_3e0->col;
          local_11c = (int)sVar2;
          local_120.row = 0;
          local_120.col = 0;
          local_b8.row = local_258.row;
          local_b8.col = local_258.col;
          local_b8 = MVar5;
          local_b4 = MVar4;
          if ((local_110 == local_118) || (local_114 == local_11c)) {
            sVar3 = (short)local_3e4;
            if ((local_110 == local_118) && (local_114 != local_11c)) {
              local_12c = sVar1 + sVar3;
              local_12a = sVar2 + local_b8.col;
              local_130 = sVar1 - sVar3;
              local_12e = sVar2 + local_b8.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_420),&local_120,
                                local_418,local_410,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_134 = (short)local_118 - local_b8.row;
              local_132 = (undefined2)local_11c;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              MVar5 = local_b8;
            }
            else if ((local_110 != local_118) && (local_114 == local_11c)) {
              local_138 = sVar1 + local_b8.row;
              local_136 = sVar2 + sVar3;
              local_13c = sVar1 + local_b8.row;
              local_13a = sVar2 - sVar3;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_420),&local_120,
                                local_418,local_410,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_140 = (undefined2)local_118;
              local_13e = (short)local_11c - local_b8.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_10c),&local_120,
                                local_108,local_100,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              MVar5 = local_b8;
            }
          }
          else {
            local_122 = sVar2 + local_b8.col;
            local_128 = sVar1 + local_b8.row;
            local_126 = sVar2;
            local_124 = sVar1;
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_420),&local_120,
                              local_418,local_410,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (uint *)CONCAT26(in_stack_fffffffffffffade,
                                               CONCAT24(in_stack_fffffffffffffadc,
                                                        CONCAT22(in_stack_fffffffffffffada,
                                                                 in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_10c),&local_120,
                              local_108,local_100,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (uint *)CONCAT26(in_stack_fffffffffffffade,
                                               CONCAT24(in_stack_fffffffffffffadc,
                                                        CONCAT22(in_stack_fffffffffffffada,
                                                                 in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
            MVar5 = local_b8;
          }
        }
      }
      local_b8 = MVar5;
      if ((local_4bc != 0) && (local_4c0 == 0)) {
        iVar7 = check_repeated_mv_and_update(in_stack_00000018,*local_4b8,local_4ec);
        if (iVar7 != 0) {
          return 0x7fffffff;
        }
        local_4ec = local_4ec + 1;
        local_4f0 = local_4f0 >> 1;
        local_48c = *local_4b8;
        local_430 = local_498;
        local_438 = local_4a0;
        local_440 = local_4b8;
        local_450 = local_4d8;
        local_458 = local_4e8;
        local_460 = local_4e0;
        local_468 = &local_4f4;
        local_470 = in_stack_00000010;
        local_478 = in_stack_00000008;
        local_47c = local_4c4;
        local_1e0 = local_498;
        local_1e8 = local_4a0;
        local_1f0 = local_4b8;
        local_200 = local_4d8;
        local_208 = local_4e8;
        local_210 = local_4e0;
        local_220 = in_stack_00000010;
        local_228 = in_stack_00000008;
        local_1d8.row = local_48c.row;
        local_230 = local_1d8.row;
        local_1d8.col = local_48c.col;
        local_22e = local_1d8.col - (short)local_4f0;
        local_234.row = 0;
        local_234.col = 0;
        local_480 = iVar6;
        local_444 = local_4f0;
        local_428 = local_48c;
        local_22c = iVar6;
        local_218 = local_468;
        local_1f4 = local_4f0;
        local_1d8 = local_48c;
        local_238 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,iVar6),&local_234,
                                      in_stack_00000008,in_stack_00000010,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_23c = local_1d8.row;
        local_23a = local_1d8.col + (short)local_1f4;
        local_240 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_22c),&local_234
                                      ,local_228,local_220,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_244 = local_1d8.row - (short)local_1f4;
        local_242 = local_1d8.col;
        local_248 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_22c),&local_234
                                      ,local_228,local_220,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_24c = local_1d8.row + (short)local_1f4;
        local_24a = local_1d8.col;
        local_250 = check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                      (MV *)CONCAT44(in_stack_fffffffffffffab4,local_22c),&local_234
                                      ,local_228,local_220,
                                      (MV_COST_PARAMS *)
                                      CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                      (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                       CONCAT24(in_stack_fffffffffffffadc,
                                                                CONCAT22(in_stack_fffffffffffffada,
                                                                         in_stack_fffffffffffffad8))
                                                      ),
                                      (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                       CONCAT24(in_stack_fffffffffffffae4,
                                                                CONCAT22(in_stack_fffffffffffffae2,
                                                                         in_stack_fffffffffffffae0))
                                                      ),
                                      (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                      CONCAT24(in_stack_fffffffffffffaec,
                                                               CONCAT22(in_stack_fffffffffffffaea,
                                                                        in_stack_fffffffffffffae8)))
                                      ,(int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                       CONCAT24(in_stack_fffffffffffffaf4,
                                                                CONCAT22(in_stack_fffffffffffffaf2,
                                                                         in_stack_fffffffffffffaf0))
                                                      ),in_stack_fffffffffffffaf8);
        local_1d4 = get_best_diag_step(local_1f4,local_238,local_240,local_248,local_250);
        local_254 = local_1d8.row + local_1d4.row;
        local_252 = local_1d8.col + local_1d4.col;
        check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                          (MV *)CONCAT44(in_stack_fffffffffffffab4,local_22c),&local_234,local_228,
                          local_220,
                          (MV_COST_PARAMS *)
                          CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                          (uint *)CONCAT26(in_stack_fffffffffffffade,
                                           CONCAT24(in_stack_fffffffffffffadc,
                                                    CONCAT22(in_stack_fffffffffffffada,
                                                             in_stack_fffffffffffffad8))),
                          (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                           CONCAT24(in_stack_fffffffffffffae4,
                                                    CONCAT22(in_stack_fffffffffffffae2,
                                                             in_stack_fffffffffffffae0))),
                          (int *)CONCAT26(in_stack_fffffffffffffaee,
                                          CONCAT24(in_stack_fffffffffffffaec,
                                                   CONCAT22(in_stack_fffffffffffffaea,
                                                            in_stack_fffffffffffffae8))),
                          (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                          CONCAT24(in_stack_fffffffffffffaf4,
                                                   CONCAT22(in_stack_fffffffffffffaf2,
                                                            in_stack_fffffffffffffaf0))),
                          in_stack_fffffffffffffaf8);
        local_484 = local_1d4;
        if (1 < local_47c) {
          local_24 = local_428;
          MVar4 = local_24;
          local_28 = local_1d4;
          MVar5 = local_28;
          local_30 = local_430;
          local_38 = local_438;
          local_40 = local_440;
          local_44 = local_444;
          local_50 = local_450;
          local_58 = local_458;
          local_60 = local_460;
          local_68 = local_468;
          local_70 = local_470;
          local_78 = local_478;
          local_7c = local_480;
          local_24.row = local_428.row;
          local_80 = (int)local_24.row;
          local_24.col = local_428.col;
          local_84 = (int)local_24.col;
          local_94 = local_440->row;
          local_88 = (int)local_94;
          local_96 = local_440->col;
          local_8c = (int)local_96;
          local_90.row = 0;
          local_90.col = 0;
          local_28.row = local_1d4.row;
          local_28.col = local_1d4.col;
          local_28 = MVar5;
          local_24 = MVar4;
          if ((local_80 == local_88) || (local_84 == local_8c)) {
            local_a0 = (short)local_444;
            if ((local_80 == local_88) && (local_84 != local_8c)) {
              local_9c = local_94 + local_a0;
              local_9a = local_96 + local_28.col;
              local_a0 = local_94 - local_a0;
              local_9e = local_96 + local_28.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_480),&local_90,
                                local_478,local_470,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_7c),&local_90,
                                local_78,local_70,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_a4 = (short)local_88 - local_28.row;
              local_a2 = (undefined2)local_8c;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_7c),&local_90,
                                local_78,local_70,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
            }
            else if ((local_80 != local_88) && (local_84 == local_8c)) {
              local_a8 = local_94 + local_28.row;
              local_a6 = local_96 + local_a0;
              local_ac = local_94 + local_28.row;
              local_aa = local_96 - local_a0;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_480),&local_90,
                                local_478,local_470,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_7c),&local_90,
                                local_78,local_70,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
              local_b0 = (undefined2)local_88;
              local_ae = (short)local_8c - local_28.col;
              check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                                (MV *)CONCAT44(in_stack_fffffffffffffab4,local_7c),&local_90,
                                local_78,local_70,
                                (MV_COST_PARAMS *)
                                CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                                (uint *)CONCAT26(in_stack_fffffffffffffade,
                                                 CONCAT24(in_stack_fffffffffffffadc,
                                                          CONCAT22(in_stack_fffffffffffffada,
                                                                   in_stack_fffffffffffffad8))),
                                (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                                 CONCAT24(in_stack_fffffffffffffae4,
                                                          CONCAT22(in_stack_fffffffffffffae2,
                                                                   in_stack_fffffffffffffae0))),
                                (int *)CONCAT26(in_stack_fffffffffffffaee,
                                                CONCAT24(in_stack_fffffffffffffaec,
                                                         CONCAT22(in_stack_fffffffffffffaea,
                                                                  in_stack_fffffffffffffae8))),
                                (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                                CONCAT24(in_stack_fffffffffffffaf4,
                                                         CONCAT22(in_stack_fffffffffffffaf2,
                                                                  in_stack_fffffffffffffaf0))),
                                in_stack_fffffffffffffaf8);
            }
          }
          else {
            local_92 = local_96 + local_28.col;
            local_98 = local_94 + local_28.row;
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_480),&local_90,
                              local_478,local_470,
                              (MV_COST_PARAMS *)
                              CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
                              (uint *)CONCAT26(in_stack_fffffffffffffade,
                                               CONCAT24(in_stack_fffffffffffffadc,
                                                        CONCAT22(in_stack_fffffffffffffada,
                                                                 in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
            check_better_fast(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
                              (MV *)CONCAT44(in_stack_fffffffffffffab4,local_7c),&local_90,local_78,
                              local_70,(MV_COST_PARAMS *)
                                       CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0)
                              ,(uint *)CONCAT26(in_stack_fffffffffffffade,
                                                CONCAT24(in_stack_fffffffffffffadc,
                                                         CONCAT22(in_stack_fffffffffffffada,
                                                                  in_stack_fffffffffffffad8))),
                              (uint *)CONCAT26(in_stack_fffffffffffffae6,
                                               CONCAT24(in_stack_fffffffffffffae4,
                                                        CONCAT22(in_stack_fffffffffffffae2,
                                                                 in_stack_fffffffffffffae0))),
                              (int *)CONCAT26(in_stack_fffffffffffffaee,
                                              CONCAT24(in_stack_fffffffffffffaec,
                                                       CONCAT22(in_stack_fffffffffffffaea,
                                                                in_stack_fffffffffffffae8))),
                              (int *)CONCAT26(in_stack_fffffffffffffaf6,
                                              CONCAT24(in_stack_fffffffffffffaf4,
                                                       CONCAT22(in_stack_fffffffffffffaf2,
                                                                in_stack_fffffffffffffaf0))),
                              in_stack_fffffffffffffaf8);
          }
        }
      }
      local_488 = local_4f4;
    }
    else {
      local_488 = 0x7fffffff;
    }
  }
  return local_488;
}

Assistant:

int av1_find_best_sub_pixel_tree_pruned(
    MACROBLOCKD *xd, const AV1_COMMON *const cm,
    const SUBPEL_MOTION_SEARCH_PARAMS *ms_params, MV start_mv,
    const FULLPEL_MV_STATS *start_mv_stats, MV *bestmv, int *distortion,
    unsigned int *sse1, int_mv *last_mv_search_list) {
  (void)cm;
  (void)start_mv_stats;
  const int allow_hp = ms_params->allow_hp;
  const int forced_stop = ms_params->forced_stop;
  const int iters_per_step = ms_params->iters_per_step;
  const int *cost_list = ms_params->cost_list;
  const SubpelMvLimits *mv_limits = &ms_params->mv_limits;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const SUBPEL_SEARCH_VAR_PARAMS *var_params = &ms_params->var_params;

  // The iteration we are current searching for. Iter 0 corresponds to fullpel
  // mv, iter 1 to half pel, and so on
  int iter = 0;
  int hstep = INIT_SUBPEL_STEP_SIZE;  // Step size, initialized to 4/8=1/2 pel
  unsigned int besterr = INT_MAX;
  *bestmv = start_mv;

  const struct scale_factors *const sf = is_intrabc_block(xd->mi[0])
                                             ? &cm->sf_identity
                                             : xd->block_ref_scale_factors[0];
  const int is_scaled = av1_is_scaled(sf);

  if (start_mv_stats != NULL && !is_scaled) {
    besterr = start_mv_stats->distortion + start_mv_stats->err_cost;
    *distortion = start_mv_stats->distortion;
    *sse1 = start_mv_stats->sse;
  } else {
    besterr =
        setup_center_error_facade(xd, cm, bestmv, var_params, mv_cost_params,
                                  sse1, distortion, is_scaled);
  }

  // If forced_stop is FULL_PEL, return.
  if (forced_stop == FULL_PEL) return besterr;

  if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
    return INT_MAX;
  }
  iter++;

  if (cost_list && cost_list[0] != INT_MAX && cost_list[1] != INT_MAX &&
      cost_list[2] != INT_MAX && cost_list[3] != INT_MAX &&
      cost_list[4] != INT_MAX) {
    const unsigned int whichdir = (cost_list[1] < cost_list[3] ? 0 : 1) +
                                  (cost_list[2] < cost_list[4] ? 0 : 2);

    const MV left_mv = { start_mv.row, start_mv.col - hstep };
    const MV right_mv = { start_mv.row, start_mv.col + hstep };
    const MV bottom_mv = { start_mv.row + hstep, start_mv.col };
    const MV top_mv = { start_mv.row - hstep, start_mv.col };

    const MV bottom_left_mv = { start_mv.row + hstep, start_mv.col - hstep };
    const MV bottom_right_mv = { start_mv.row + hstep, start_mv.col + hstep };
    const MV top_left_mv = { start_mv.row - hstep, start_mv.col - hstep };
    const MV top_right_mv = { start_mv.row - hstep, start_mv.col + hstep };

    int dummy = 0;

    switch (whichdir) {
      case 0:  // bottom left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_left_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 1:  // bottom right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &bottom_right_mv, bestmv, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, &dummy, is_scaled);
        break;
      case 2:  // top left quadrant
        check_better_fast(xd, cm, &left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_left_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
      case 3:  // top right quadrant
        check_better_fast(xd, cm, &right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        check_better_fast(xd, cm, &top_right_mv, bestmv, mv_limits, var_params,
                          mv_cost_params, &besterr, sse1, distortion, &dummy,
                          is_scaled);
        break;
    }
  } else {
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  // Each subsequent iteration checks at least one point in common with
  // the last iteration could be 2 ( if diag selected) 1/4 pel
  if (forced_stop < HALF_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  if (allow_hp && forced_stop == EIGHTH_PEL) {
    if (check_repeated_mv_and_update(last_mv_search_list, *bestmv, iter)) {
      return INT_MAX;
    }
    iter++;

    hstep >>= 1;
    start_mv = *bestmv;
    two_level_checks_fast(xd, cm, start_mv, bestmv, hstep, mv_limits,
                          var_params, mv_cost_params, &besterr, sse1,
                          distortion, iters_per_step, is_scaled);
  }

  return besterr;
}